

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O0

string * fs_cpu_arch_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  allocator<char> local_197;
  undefined1 local_196 [8];
  utsname buf;
  
  iVar1 = uname((utsname *)local_196);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,buf.version + 0x39,&local_197);
    std::allocator<char>::~allocator(&local_197);
  }
  else {
    fs_print_error("","fs_cpu_arch");
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string fs_cpu_arch()
{
#ifdef HAVE_UTSNAME

  if (struct utsname buf;
       uname(&buf) == 0)
    return buf.machine;

  fs_print_error("", __func__);
#elif defined(_WIN32)
// https://learn.microsoft.com/en-us/windows/win32/api/sysinfoapi/ns-sysinfoapi-system_info
    SYSTEM_INFO si;
    GetNativeSystemInfo(&si);
    switch (si.wProcessorArchitecture) {
    case PROCESSOR_ARCHITECTURE_AMD64:
        return "x86_64";
    case PROCESSOR_ARCHITECTURE_ARM:
        return "arm";
    case PROCESSOR_ARCHITECTURE_ARM64:
        return "arm64";
    case PROCESSOR_ARCHITECTURE_IA64:
        return "ia64";
    case PROCESSOR_ARCHITECTURE_INTEL:
        return "x86";
    case PROCESSOR_ARCHITECTURE_UNKNOWN:
    default:
        return "unknown";
    }
#endif

  return {};
}